

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

overlap_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::find
          (overlap_iterator *__return_storage_ptr__,
          IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *this,unsigned_long left,
          unsigned_long right)

{
  (__return_storage_ptr__->super_iterator).super_const_iterator.map = this;
  (__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)(__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement;
  (__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  (__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  (__return_storage_ptr__->searchKey).left = left;
  (__return_storage_ptr__->searchKey).right = right;
  overlap_iterator::setToBegin(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

overlap_iterator find(TKey left, TKey right) const {
        overlap_iterator it(*this, left, right);
        it.setToBegin();
        return it;
    }